

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBLookupTables.cpp
# Opt level: O0

char * GetUSBClassName(U8 classCode)

{
  IdNamePair *pIVar1;
  IdNamePair *res;
  IdNamePair srch;
  size_t NUM_ITEMS;
  char *pcStack_10;
  U8 classCode_local;
  
  srch.name = (char *)0x14;
  res._0_2_ = (ushort)classCode;
  pIVar1 = std::lower_bound<IdNamePair_const*,IdNamePair>
                     (ClassCodes,(IdNamePair *)UsageTables,(IdNamePair *)&res);
  if ((pIVar1->id == (ushort)classCode) && (pIVar1->name != (char *)0x0)) {
    pcStack_10 = pIVar1->name;
  }
  else {
    pcStack_10 = "<unknown>";
  }
  return pcStack_10;
}

Assistant:

const char* GetUSBClassName( U8 classCode )
{
    const size_t NUM_ITEMS = sizeof( ClassCodes ) / sizeof( IdNamePair );

    IdNamePair srch;
    srch.id = classCode;

    const IdNamePair* res = std::lower_bound( ClassCodes, ClassCodes + NUM_ITEMS, srch );

    if( res->id == classCode && res->name != NULL )
        return res->name;

    return "<unknown>";
}